

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__s;
  stbi_uc *psVar4;
  undefined8 in_RCX;
  int *in_RDX;
  int *in_RSI;
  int y;
  int x;
  int i;
  stbi_uc *result;
  int in_stack_00000040;
  int in_stack_00000044;
  stbi__context *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  uchar *local_8;
  
  for (iVar5 = 0; iVar5 < 0x5c; iVar5 = iVar5 + 1) {
    stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  iVar1 = stbi__get16be((stbi__context *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
  iVar2 = stbi__get16be((stbi__context *)CONCAT44(iVar5,iVar1));
  iVar3 = stbi__at_eof((stbi__context *)CONCAT44(iVar2,in_stack_ffffffffffffffb8));
  if (iVar3 == 0) {
    if ((int)(0x10000000 / (long)iVar1) < iVar2) {
      stbi__err("too large");
      local_8 = (uchar *)0x0;
    }
    else {
      stbi__get32be((stbi__context *)CONCAT44(iVar5,iVar1));
      stbi__get16be((stbi__context *)CONCAT44(iVar5,iVar1));
      stbi__get16be((stbi__context *)CONCAT44(iVar5,iVar1));
      __s = stbi__malloc(0x114992);
      memset(__s,0xff,(long)(iVar1 * iVar2 * 4));
      psVar4 = stbi__pic_load_core(in_stack_00000048,in_stack_00000044,in_stack_00000040,(int *)s,
                                   (stbi_uc *)px);
      if (psVar4 == (stbi_uc *)0x0) {
        free(__s);
      }
      *in_RSI = iVar1;
      *in_RDX = iVar2;
      local_8 = stbi__convert_format
                          ((uchar *)in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
                           (uint)((ulong)in_RCX >> 0x20),(uint)in_RCX);
    }
  }
  else {
    stbi__err("bad file");
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

static stbi_uc *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp)
{
   stbi_uc *result;
   int i, x,y;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if ((1 << 28) / x < y) return stbi__errpuc("too large", "Image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc(x*y*4);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}